

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void printStatistics(Instance *instance)

{
  bool bVar1;
  ostream *poVar2;
  
  bVar1 = Instance::solve(instance);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"SAT");
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"VSS: ");
    Instance::num_vss(instance);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"MAKESPAN: ");
    Instance::makespan(instance);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<((ostream *)&std::cout,"Sum Times: ");
    Instance::sum_times(instance);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"UNSAT");
  }
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&std::cout,"CONSTRAINT TIME: ");
  poVar2 = std::ostream::_M_insert<double>(instance->constraint_t);
  std::operator<<(poVar2,"\n");
  std::operator<<((ostream *)&std::cout,"SOLVE TIME: ");
  poVar2 = std::ostream::_M_insert<double>(instance->solve_t);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void printStatistics(Instance* instance) {
  if(instance->solve()) {
    std::cout << "SAT" << "\n";
    std::cout << "VSS: " << instance->num_vss() << "\n";
    std::cout << "MAKESPAN: " << instance->makespan() << "\n";
    std::cout << "Sum Times: " << instance->sum_times() << "\n";

  } else {
    std::cout << "UNSAT" << "\n";
  }
  std::cout << "CONSTRAINT TIME: " << instance->constraint_t << "\n";
  std::cout << "SOLVE TIME: " << instance->solve_t << "\n";
}